

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O1

bool __thiscall ManifestParser::ParseFileInclude(ManifestParser *this,bool new_scope,string *err)

{
  Lexer *this_00;
  BindingEnv *pBVar1;
  bool bVar2;
  _Rb_tree_header *p_Var3;
  string path;
  EvalString eval;
  string local_b8;
  EvalString local_98;
  Parser local_80;
  BindingEnv *local_38;
  ManifestParserOptions local_30;
  undefined1 local_28;
  
  local_98.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Parser).lexer_;
  bVar2 = Lexer::ReadEvalString(this_00,&local_98,true,err);
  if (bVar2) {
    EvalString::Evaluate_abi_cxx11_(&local_b8,&local_98,&this->env_->super_Env);
    local_80.state_ = (this->super_Parser).state_;
    local_80.file_reader_ = (this->super_Parser).file_reader_;
    local_30 = this->options_;
    local_80.lexer_.filename_.str_ = (char *)0x0;
    local_80.lexer_.filename_.len_ = 0;
    local_80.lexer_.input_.str_ = (char *)0x0;
    local_80.lexer_.input_.len_ = 0;
    local_80._vptr_Parser = (_func_int **)&PTR_Parse_0012cd80;
    local_28 = 0;
    local_38 = &(local_80.state_)->bindings_;
    if (new_scope) {
      local_38 = (BindingEnv *)operator_new(0x70);
      pBVar1 = this->env_;
      (local_38->super_Env)._vptr_Env = (_func_int **)&PTR__BindingEnv_0012ccf0;
      p_Var3 = &(local_38->bindings_)._M_t._M_impl.super__Rb_tree_header;
      (local_38->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (local_38->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (local_38->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var3->_M_header;
      (local_38->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var3->_M_header;
      (local_38->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var3 = &(local_38->rules_)._M_t._M_impl.super__Rb_tree_header;
      (local_38->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (local_38->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (local_38->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      (local_38->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
      (local_38->rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_38->parent_ = pBVar1;
    }
    else {
      local_38 = this->env_;
    }
    bVar2 = Parser::Load(&local_80,&local_b8,err,this_00);
    if (bVar2) {
      bVar2 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&local_98.parsed_);
  return bVar2;
}

Assistant:

bool ManifestParser::ParseFileInclude(bool new_scope, string* err) {
  EvalString eval;
  if (!lexer_.ReadPath(&eval, err))
    return false;
  string path = eval.Evaluate(env_);

  ManifestParser subparser(state_, file_reader_, options_);
  if (new_scope) {
    subparser.env_ = new BindingEnv(env_);
  } else {
    subparser.env_ = env_;
  }

  if (!subparser.Load(path, err, &lexer_))
    return false;

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  return true;
}